

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_table_as_nested_root
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              char *fid,uint16_t align,flatcc_table_verifier_f *tvf)

{
  uint *puVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  undefined6 in_register_00000082;
  uint *buf;
  flatcc_table_verifier_descriptor_t local_50;
  ulong uVar7;
  
  uVar5 = CONCAT62(in_register_00000082,align) & 0xffffffff;
  iVar4 = flatcc_verify_vector_field(td,id,required,uVar5,1,0xffffffff);
  if (iVar4 != 0) {
    iVar4 = flatcc_verify_vector_field(td,id,required,uVar5,1,0xffffffff);
    return iVar4;
  }
  uVar2 = id * 2 + 4;
  iVar4 = 0;
  if ((uVar2 < td->vsize) &&
     (uVar5 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar2), uVar5 != 0)) {
    puVar1 = (uint *)((long)td->buf +
                     (ulong)*(uint *)((long)td->buf + uVar5 + td->table) + uVar5 + td->table);
    buf = puVar1 + 1;
    uVar3 = *puVar1;
    uVar5 = (ulong)uVar3;
    iVar4 = flatcc_verify_buffer_header(buf,uVar5,fid);
    if (iVar4 == 0) {
      local_50.table = *buf;
      local_50.ttl = td->ttl + -1;
      if (local_50.ttl == 0) {
        iVar4 = 3;
      }
      else {
        iVar4 = 0xf;
        if ((local_50.table != 0) &&
           ((local_50.table & 3) == 0 && (ulong)local_50.table + 4 <= uVar5)) {
          uVar6 = local_50.table - *(int *)((long)buf + (ulong)local_50.table);
          uVar7 = (ulong)uVar6;
          iVar4 = 0x1d;
          if ((uVar6 & 1) == 0 && -1 < (int)uVar6) {
            iVar4 = 0x1b;
            if (uVar7 + 2 <= uVar5) {
              local_50.vsize = *(ushort *)((long)buf + uVar7);
              iVar4 = 0x1e;
              if ((((local_50.vsize & 1) == 0) && (local_50.vsize + uVar6 <= uVar3)) &&
                 (iVar4 = 0x1c, 3 < local_50.vsize)) {
                local_50.tsize = *(ushort *)((long)buf + uVar7 + 2);
                iVar4 = 0x14;
                if ((uint)local_50.tsize <= uVar3 - local_50.table) {
                  local_50.vtable = (void *)(uVar7 + (long)buf);
                  local_50.buf = buf;
                  local_50.end = uVar3;
                  iVar4 = (*tvf)(&local_50);
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int flatcc_verify_table_as_nested_root(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, const char *fid,
        uint16_t align, flatcc_table_verifier_f tvf)
{
    const uoffset_t *buf;
    uoffset_t bufsiz;

    check_result(flatcc_verify_vector_field(td, id, required, align, 1, FLATBUFFERS_COUNT_MAX(1)));
    if (0 == (buf = get_field_ptr(td, id))) {
        return flatcc_verify_ok;
    }
    buf = (const uoffset_t *)((size_t)buf + read_uoffset(buf, 0));
    bufsiz = read_uoffset(buf, 0);
    ++buf;
    /*
     * Don't verify nested buffers identifier - information is difficult to get and
     * might not be what is desired anyway. User can do it later.
     */
    check_result(flatcc_verify_buffer_header(buf, bufsiz, fid));
    return verify_table(buf, bufsiz, 0, read_uoffset(buf, 0), td->ttl, tvf);
}